

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::clear(QComboBox *this)

{
  long lVar1;
  long *plVar2;
  undefined4 uVar3;
  QPersistentModelIndex *this_00;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QArrayDataPointer<char16_t> local_b8;
  QVariant local_98;
  QModelIndex local_78;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar2 = *(long **)(lVar1 + 0x298);
  this_00 = (QPersistentModelIndex *)(lVar1 + 0x2c0);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
  uVar3 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_78);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
  (**(code **)(*plVar2 + 0x108))(plVar2,0,uVar3,(QModelIndex *)&local_98);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  local_b8.size = 0;
  ::QVariant::QVariant(&local_98,(QString *)&local_b8);
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_78,(QObject *)this,&local_98);
  ::QVariant::~QVariant(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::clear()
{
    Q_D(QComboBox);
    d->model->removeRows(0, d->model->rowCount(d->root), d->root);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, QString());
    QAccessible::updateAccessibility(&event);
#endif
}